

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

void __thiscall Problem_CGBG_FF::AssignAgentTypesToHouses(Problem_CGBG_FF *this)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pSVar4;
  iterator iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  ostream *poVar10;
  undefined4 extraout_var_00;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t new_nr;
  ulong uVar15;
  ulong uVar16;
  Index agI;
  undefined1 auVar17 [64];
  undefined1 in_XMM2 [16];
  Index hI;
  uint local_40;
  Index local_3c;
  Problem_CGBG_FF *local_38;
  undefined1 extraout_var_01 [56];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             ">>Assigning observation houses to agents --- only allowing \'action houses\' <<",0x4d)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  iVar8 = (*(this->super_BayesianGameCollaborativeGraphical).
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
  if (CONCAT44(extraout_var,iVar8) != 0) {
    uVar12 = 0;
    local_38 = this;
    do {
      pvVar2 = (this->_m_houseIndices_action).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = ((long)(this->_m_houseIndices_action).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
               -0x5555555555555555;
      uVar15 = uVar12;
      if (uVar13 < uVar12 || uVar13 - uVar12 == 0) {
LAB_00392fc2:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar15);
      }
      lVar9 = *(long *)&pvVar2[uVar12].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar11 = (long)pvVar2[uVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - lVar9;
      agI = (Index)uVar12;
      if (lVar11 != 0) {
        uVar13 = lVar11 >> 2;
        uVar16 = 0;
        do {
          pvVar3 = (this->_m_houseIndices_obs).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((long)(this->_m_houseIndices_obs).
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                   -0x5555555555555555;
          uVar15 = uVar12;
          if (uVar14 < uVar12 || uVar14 - uVar12 == 0) goto LAB_00392fc2;
          if ((long)pvVar3[uVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              *(long *)&pvVar3[uVar12].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data >> 2 == this->_m_nrObservedHousesPerAgents) {
            uVar16 = uVar13 & 0xffffffff;
          }
          else {
            local_40 = *(uint *)(lVar9 + uVar16 * 4);
            uVar15 = (ulong)local_40;
            pSVar4 = (this->_m_agentsForHouse_obs).super__Vector_base<Scope,_std::allocator<Scope>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar13 = ((long)(this->_m_agentsForHouse_obs).
                            super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pSVar4 >> 3) *
                     -0x5555555555555555;
            if (uVar13 < uVar15 || uVar13 - uVar15 == 0) goto LAB_00392fc2;
            iVar5._M_current =
                 pSVar4[uVar15].super_SDT.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if ((ulong)((long)iVar5._M_current -
                        *(long *)&pSVar4[uVar15].super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl >> 2) < this->_m_maxNrAgentsObservingAHouse) {
              pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pSVar4 + uVar15);
              local_3c = agI;
              if (iVar5._M_current == *(uint **)(pvVar1 + 0x10)) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar5,&local_3c);
              }
              else {
                *iVar5._M_current = agI;
                *(uint **)(pvVar1 + 8) = iVar5._M_current + 1;
              }
              pvVar3 = (this->_m_houseIndices_obs).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = ((long)(this->_m_houseIndices_obs).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                       -0x5555555555555555;
              uVar15 = uVar12;
              if (uVar13 < uVar12 || uVar13 - uVar12 == 0) goto LAB_00392fc2;
              pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar3 + uVar12);
              iVar5._M_current = *(uint **)(pvVar1 + 8);
              if (iVar5._M_current == *(uint **)(pvVar1 + 0x10)) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar5,&local_40);
              }
              else {
                *iVar5._M_current = local_40;
                *(uint **)(pvVar1 + 8) = iVar5._M_current + 1;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Assigning house ",0x10);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," to agent ",10);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"House  ",7);
              this = local_38;
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,
                         " is at full \'capacity\' (it has k agents in its scope), removing it from further consideration\n"
                         ,0x5e);
            }
          }
          uVar16 = (ulong)((int)uVar16 + 1);
          lVar9 = *(long *)&pvVar2[uVar12].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data;
          uVar13 = (long)pvVar2[uVar12].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - lVar9 >> 2;
        } while (uVar16 < uVar13);
      }
      pvVar2 = (this->_m_houseIndices_obs).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = ((long)(this->_m_houseIndices_obs).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
               -0x5555555555555555;
      uVar15 = uVar12;
      if (uVar13 < uVar12 || uVar13 - uVar12 == 0) goto LAB_00392fc2;
      uVar12 = (long)pvVar2[uVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               *(long *)&pvVar2[uVar12].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data >> 2;
      if (uVar12 < this->_m_nrObservedHousesPerAgents) {
        auVar6 = vcvtusi2sd_avx512f(in_XMM2,this->_m_nrObsPerHouse);
        auVar7 = vcvtusi2sd_avx512f(in_XMM2,uVar12);
        auVar17._0_8_ = pow(auVar6._0_8_,auVar7._0_8_);
        auVar17._8_56_ = extraout_var_01;
        new_nr = vcvttsd2usi_avx512f(auVar17._0_16_);
        BayesianGameBase::ChangeNrTypes((BayesianGameBase *)this,agI,new_nr);
      }
      uVar12 = (ulong)(agI + 1);
      iVar8 = (*(this->super_BayesianGameCollaborativeGraphical).
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
    } while (uVar12 < CONCAT44(extraout_var_00,iVar8));
  }
  return;
}

Assistant:

void Problem_CGBG_FF::AssignAgentTypesToHouses()
{
#define TYPES_INDEP_OF_ACTIONS 0 
#if TYPES_INDEP_OF_ACTIONS     
#if DEBUGASSIGN
    cout << ">>Assigning observation houses to agents --- independent of actions <<"<<endl;
#endif
    set<Index> availableHouses;
    for(Index hI=0; hI < _m_nrHouses; hI++)
        availableHouses.insert(hI);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        FixedCapacityPriorityQueue< diPair, diPairComp > pq( _m_nrObservedHousesPerAgents );
        for(set<Index>::iterator it=availableHouses.begin(); 
                it != availableHouses.end(); it++)            
        {
            Index hI = *it;
            double d = ComputeDistanceAgentToHouse(agI, hI);
            diPair p(d, hI);
            diPair overflown;
            pq.insert( p, overflown );
        }
        while(! pq.empty())
        {
            diPair p = pq.top();
            Index hI = p.second;
#if DEBUGASSIGN
            double d = p.first;
            cout << "Assigning house "<<hI<<" to agent " << agI <<
                " it has distance " << d << endl;
#endif
            _m_agentsForHouse_obs.at(hI).Insert(agI);
            _m_houseIndices_obs.at(agI).push_back(hI);
            if( _m_agentsForHouse_obs.at(hI).size() == _m_maxNrAgentsObservingAHouse )
            {
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
                availableHouses.erase(hI);
            }
            pq.pop();
        }
        //check how many observer house the agent actually got (could be less than _m_nrObservedHousesPerAgents!)
        if (_m_houseIndices_obs.at(agI).size() <  _m_nrObservedHousesPerAgents)
        {
            size_t nrTypes =  pow(_m_nrObsPerHouse, _m_houseIndices_obs.at(agI).size());
            ChangeNrTypes(agI, nrTypes);
        }
    }
#else // if not TYPES_INDEP_OF_ACTIONS     
#if DEBUGASSIGN
    cout << ">>Assigning observation houses to agents --- only allowing 'action houses' <<"<<endl;
#endif
    //set<Index> availableHouses;
    //for(Index hI=0; hI < _m_nrHouses; hI++)
        //availableHouses.insert(hI);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        const std::vector<Index> & houses_agI = _m_houseIndices_action.at(agI);
        for(Index i = 0; i < houses_agI.size(); i++)
        {
            if (_m_houseIndices_obs.at(agI).size() == _m_nrObservedHousesPerAgents)     
            {
                //agent has reached the maximum number of house, no point in looping to remaining houses
                i =  houses_agI.size();
                continue;
            }

            Index hI = houses_agI.at(i); //<-the candidate house index
            //assign this house if it is not at capacity yet
            if  (_m_agentsForHouse_obs.at(hI).size() < _m_maxNrAgentsObservingAHouse)   //this house is not at full capacity?
            {
                _m_agentsForHouse_obs.at(hI).Insert(agI);
                _m_houseIndices_obs.at(agI).push_back(hI);
#if DEBUGASSIGN
                cout << "Assigning house "<<hI<<" to agent " << agI << endl;
#endif            
            }
            else
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
            }

/*        
        FixedCapacityPriorityQueue< diPair, diPairComp > pq( _m_nrObservedHousesPerAgents );
        for(set<Index>::iterator it=availableHouses.begin(); 
                it != availableHouses.end(); it++)            
        {
            Index hI = *it;
            double d = ComputeDistanceAgentToHouse(agI, hI);
            diPair p(d, hI);
            diPair overflown;
            pq.insert( p, overflown );
        }
        while(! pq.empty())
        {
            diPair p = pq.top();
            Index hI = p.second;
#if DEBUGASSIGN
            double d = p.first;
            cout << "Assigning house "<<hI<<" to agent " << agI <<
                " it has distance " << d << endl;
#endif
            _m_agentsForHouse_obs.at(hI).Insert(agI);
            _m_houseIndices_obs.at(agI).push_back(hI);
            if( _m_agentsForHouse_obs.at(hI).size() == _m_maxNrAgentsObservingAHouse )
            {
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
                availableHouses.erase(hI);
            }
            pq.pop();
        }
*/        
        //check how many observed houses the agent actually got (could be less than _m_nrObservedHousesPerAgents!)
        if (_m_houseIndices_obs.at(agI).size() <  _m_nrObservedHousesPerAgents)
        {
            size_t nrTypes =  pow(_m_nrObsPerHouse, _m_houseIndices_obs.at(agI).size());
            ChangeNrTypes(agI, nrTypes);
        }
    }
#endif // ends if TYPES_INDEP_OF_ACTIONS     
}